

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

void Gia_ManDupCleanDfs_rec(Gia_Obj_t *pObj)

{
  uint uVar1;
  
  while( true ) {
    if (pObj->Value == 0xffffffff) {
      return;
    }
    pObj->Value = 0xffffffff;
    uVar1 = (uint)*(undefined8 *)pObj;
    if ((~uVar1 & 0x9fffffff) == 0) break;
    if (((int)uVar1 < 0) || ((uVar1 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                    ,0xfdb,"void Gia_ManDupCleanDfs_rec(Gia_Obj_t *)");
    }
    Gia_ManDupCleanDfs_rec(pObj + -(ulong)(uVar1 & 0x1fffffff));
    pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  return;
}

Assistant:

void Gia_ManDupCleanDfs_rec( Gia_Obj_t * pObj )
{
    if ( !~pObj->Value )
        return;
    pObj->Value = ~0;
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManDupCleanDfs_rec( Gia_ObjFanin0(pObj) );
    Gia_ManDupCleanDfs_rec( Gia_ObjFanin1(pObj) );
}